

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

void __thiscall rw::Frame::destroy(Frame *this)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  LLLink *pLVar3;
  Frame *pFVar4;
  
  pLVar3 = (this->objectList).link.next;
  while (pLVar3 != &(this->objectList).link) {
    pLVar1 = pLVar3->next;
    if (pLVar3[-1].prev != (LLLink *)0x0) {
      pLVar2 = pLVar3->prev;
      pLVar2->next = pLVar3->next;
      pLVar3->next->prev = pLVar2;
    }
    pLVar3[-1].prev = (LLLink *)0x0;
    pLVar3 = pLVar1;
  }
  PluginList::destruct((PluginList *)&s_plglist,this);
  if ((this->object).parent != (void *)0x0) {
    removeChild(this);
  }
  if (((this->object).privateFlags & 3) != 0) {
    pLVar3 = (this->inDirtyList).prev;
    pLVar3->next = (this->inDirtyList).next;
    ((this->inDirtyList).next)->prev = pLVar3;
  }
  for (pFVar4 = this->child; pFVar4 != (Frame *)0x0; pFVar4 = pFVar4->next) {
    (pFVar4->object).parent = (void *)0x0;
  }
  (*DAT_00149de0)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Frame::destroy(void)
{
	FORLIST(lnk, this->objectList)
		ObjectWithFrame::fromFrame(lnk)->setFrame(nil);
	s_plglist.destruct(this);
	if(this->getParent())
		this->removeChild();
	if(this->object.privateFlags & Frame::HIERARCHYSYNC)
		this->inDirtyList.remove();
	for(Frame *f = this->child; f; f = f->next)
		f->object.parent = nil;
	rwFree(this);
	numAllocated--;
}